

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::extAddPairwise<4,short,int>(Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  Type *this_00;
  int32_t iVar1;
  int32_t iVar2;
  reference pvVar3;
  reference this_01;
  Literal local_168;
  ulong local_150;
  size_t i;
  undefined1 local_138 [8];
  LaneArray<4> result;
  LaneArray<4_*_2> lanes;
  Literal *vec_local;
  
  getLanes<short,8>((LaneArray<8> *)&result._M_elems[3].type,this,vec);
  std::array<wasm::Literal,_4UL>::array((array<wasm::Literal,_4UL> *)local_138);
  for (local_150 = 0; local_150 < 4; local_150 = local_150 + 1) {
    this_00 = &result._M_elems[3].type;
    pvVar3 = std::array<wasm::Literal,_8UL>::operator[]
                       ((array<wasm::Literal,_8UL> *)this_00,local_150 * 2);
    iVar1 = Literal::geti32(pvVar3);
    pvVar3 = std::array<wasm::Literal,_8UL>::operator[]
                       ((array<wasm::Literal,_8UL> *)this_00,local_150 * 2 + 1);
    iVar2 = Literal::geti32(pvVar3);
    Literal::Literal(&local_168,(int)(short)iVar1 + (int)(short)iVar2);
    this_01 = std::array<wasm::Literal,_4UL>::operator[]
                        ((array<wasm::Literal,_4UL> *)local_138,local_150);
    Literal::operator=(this_01,&local_168);
    Literal::~Literal(&local_168);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<4> *)local_138);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_138);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&result._M_elems[3].type);
  return __return_storage_ptr__;
}

Assistant:

static Literal extAddPairwise(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; i++) {
    result[i] = Literal((LaneTo)(LaneFrom)lanes[i * 2 + 0].geti32() +
                        (LaneTo)(LaneFrom)lanes[i * 2 + 1].geti32());
  }
  return Literal(result);
}